

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_terminal.cpp
# Opt level: O3

void __thiscall ImportBool_True_Test::TestBody(ImportBool_True_Test *this)

{
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer message;
  char *in_R9;
  bool v;
  bool local_121;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_120;
  AssertHelper local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  AssertHelper local_108;
  internal local_100;
  undefined7 uStack_ff;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  long local_f0 [2];
  string local_e0;
  not_null<bool_*> local_c0;
  parser<pstore::exchange::import_ns::callbacks> local_b8;
  
  local_c0.ptr_ = &local_121;
  local_121 = false;
  pstore::gsl::not_null<bool_*>::ensure_invariant(&local_c0);
  anon_unknown.dwarf_4c4c93::ImportBool::make_json_bool_parser
            (&local_b8,&this->super_ImportBool,local_c0);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::input(&local_b8,"true");
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(&local_b8);
  local_118.data_._0_1_ = (internal)(local_b8.error_._M_value == 0);
  local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)local_118.data_._0_1_) {
    local_e0._M_dataplus._M_p._0_1_ = 1;
    testing::internal::CmpHelperEQ<bool,bool>(&local_100,"v","true",&local_121,(bool *)&local_e0);
    if (local_100 == (internal)0x0) {
      testing::Message::Message((Message *)&local_e0);
      if (local_f8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = (local_f8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_terminal.cpp"
                 ,0x42,message);
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      if ((long *)CONCAT71(local_e0._M_dataplus._M_p._1_7_,local_e0._M_dataplus._M_p._0_1_) !=
          (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_e0._M_dataplus._M_p._1_7_,
                                       local_e0._M_dataplus._M_p._0_1_) + 8))();
      }
    }
    if (local_f8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_001867d6;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_f8;
  }
  else {
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_110;
    testing::Message::Message((Message *)&local_120);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_120._M_head_impl + 0x10),"JSON error was: ",0x10);
    (**(code **)(*(long *)local_b8.error_._M_cat + 0x20))
              (&local_100,local_b8.error_._M_cat,local_b8.error_._M_value);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_120._M_head_impl + 0x10),(char *)CONCAT71(uStack_ff,local_100),
               (long)local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e0,(internal *)&local_118,(AssertionResult *)0x1d9922,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_terminal.cpp"
               ,0x41,(char *)CONCAT71(local_e0._M_dataplus._M_p._1_7_,
                                      local_e0._M_dataplus._M_p._0_1_));
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_e0._M_dataplus._M_p._1_7_,local_e0._M_dataplus._M_p._0_1_) !=
        &local_e0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_e0._M_dataplus._M_p._1_7_,local_e0._M_dataplus._M_p._0_1_),
                      local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(uStack_ff,local_100) != local_f0) {
      operator_delete((long *)CONCAT71(uStack_ff,local_100),local_f0[0] + 1);
    }
    if (local_120._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_120._M_head_impl + 8))();
    }
    local_f8 = local_110;
    if (local_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_001867d6;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_f8);
LAB_001867d6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.string_._M_dataplus._M_p != &local_b8.string_.field_2) {
    operator_delete(local_b8.string_._M_dataplus._M_p,
                    local_b8.string_.field_2._M_allocated_capacity + 1);
  }
  if (local_b8.callbacks_.context_.
      super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.callbacks_.context_.
               super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  ::~deque(&local_b8.stack_.c);
  if ((_Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
       )local_b8.singletons_._M_t.
        super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
        .
        super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
        ._M_head_impl != (singleton_storage<pstore::exchange::import_ns::callbacks> *)0x0) {
    operator_delete((void *)local_b8.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
                            ._M_head_impl,0x68);
  }
  return;
}

Assistant:

TEST_F (ImportBool, True) {
    bool v = false;
    auto parser = make_json_bool_parser (&v);
    parser.input ("true");
    parser.eof ();

    // Check the result.
    ASSERT_FALSE (parser.has_error ()) << "JSON error was: " << parser.last_error ().message ();
    EXPECT_EQ (v, true);
}